

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

int ConvexDecomposition::overhull
              (Plane *planes,int planes_count,float3 *verts,int verts_count,int maxplanes,
              float3 **verts_out,int *verts_count_out,int **faces_out,int *faces_count_out,
              float inflate)

{
  Array<ConvexDecomposition::ConvexH::HalfEdge> *pAVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  float3 *pfVar7;
  Plane *pPVar8;
  HalfEdge *__ptr;
  float3 *pfVar9;
  undefined8 uVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  int iVar22;
  int iVar23;
  ConvexH *convex;
  ulong uVar24;
  ConvexH *convex_00;
  int *piVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  char *__function;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  ConvexH *tmp;
  bool bVar32;
  bool bVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float3 local_50;
  float3 local_40;
  
  iVar23 = 0;
  if (3 < verts_count) {
    uVar2 = verts->x;
    uVar3 = verts->y;
    auVar38._4_4_ = uVar3;
    auVar38._0_4_ = uVar2;
    auVar38._8_8_ = 0;
    auVar37 = ZEXT464((uint)verts->z);
    lVar27 = 0;
    auVar36 = ZEXT416((uint)verts->z);
    auVar16 = auVar38;
    do {
      auVar39 = ZEXT416(*(uint *)((long)&verts->x + lVar27));
      auVar13 = vminss_avx(auVar38,auVar39);
      auVar38 = vmovshdup_avx(auVar38);
      auVar40 = ZEXT416(*(uint *)((long)&verts->y + lVar27));
      auVar14 = vminss_avx(auVar38,auVar40);
      auVar41 = ZEXT416(*(uint *)((long)&verts->z + lVar27));
      auVar15 = vminss_avx(auVar37._0_16_,auVar41);
      auVar37 = ZEXT1664(auVar15);
      auVar38 = vinsertps_avx(auVar13,auVar14,0x10);
      auVar39 = vmaxss_avx(auVar16,auVar39);
      auVar16 = vmovshdup_avx(auVar16);
      auVar40 = vmaxss_avx(auVar16,auVar40);
      auVar36 = vmaxss_avx(auVar36,auVar41);
      auVar16 = vinsertps_avx(auVar39,auVar40,0x10);
      lVar27 = lVar27 + 0xc;
    } while ((ulong)(uint)verts_count * 0xc != lVar27);
    if (planes_count <= maxplanes) {
      maxplanes = planes_count;
    }
    fVar17 = auVar13._0_4_ - inflate;
    fVar18 = auVar14._0_4_ - inflate;
    fVar19 = auVar15._0_4_ - inflate;
    fVar34 = auVar39._0_4_ + inflate;
    fVar11 = auVar40._0_4_ + inflate;
    fVar12 = auVar36._0_4_ + inflate;
    if (0 < planes_count) {
      lVar27 = 0;
      do {
        *(float *)((long)&planes->dist + lVar27) =
             *(float *)((long)&planes->dist + lVar27) - inflate;
        lVar27 = lVar27 + 0x10;
      } while ((ulong)(uint)planes_count << 4 != lVar27);
    }
    fVar20 = fVar34 - fVar17;
    fVar35 = fVar11 - fVar18;
    fVar21 = fVar12 - fVar19;
    fVar20 = fVar21 * fVar21 + fVar20 * fVar20 + fVar35 * fVar35;
    if (fVar20 < 0.0) {
      fVar35 = sqrtf(fVar20);
    }
    else {
      auVar38 = vsqrtss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20));
      fVar35 = auVar38._0_4_;
    }
    auVar38 = vinsertps_avx(ZEXT416((uint)fVar17),ZEXT416((uint)fVar18),0x10);
    auVar16 = vinsertps_avx(ZEXT416((uint)fVar34),ZEXT416((uint)fVar11),0x10);
    if (fVar20 < 0.0) {
      fVar34 = sqrtf(fVar20);
    }
    else {
      auVar36 = vsqrtss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20));
      fVar34 = auVar36._0_4_;
    }
    planetestepsilon = fVar34 * 0.001;
    local_40._0_8_ = vmovlps_avx(auVar38);
    local_50._0_8_ = vmovlps_avx(auVar16);
    local_50.z = fVar12;
    local_40.z = fVar19;
    convex = ConvexHMakeCube(&local_40,&local_50);
    do {
      bVar32 = maxplanes == 0;
      maxplanes = maxplanes + -1;
      if (bVar32) break;
      if (planes_count < 1) {
        fVar34 = 0.0;
        uVar29 = 0;
      }
      else {
        uVar5 = (convex->vertices).count;
        uVar30 = 0;
        fVar34 = 0.0;
        uVar24 = 0;
        do {
          auVar37 = ZEXT1664(ZEXT816(0) << 0x40);
          if (0 < (int)uVar5) {
            pfVar7 = (convex->vertices).element;
            lVar27 = 0;
            do {
              auVar38 = vfmadd231ss_fma(ZEXT416((uint)(planes[uVar30].normal.y *
                                                      *(float *)((long)&pfVar7->y + lVar27))),
                                        ZEXT416((uint)planes[uVar30].normal.x),
                                        ZEXT416(*(uint *)((long)&pfVar7->x + lVar27)));
              auVar38 = vfmadd231ss_fma(auVar38,ZEXT416((uint)planes[uVar30].normal.z),
                                        ZEXT416(*(uint *)((long)&pfVar7->z + lVar27)));
              auVar38 = vmaxss_avx(auVar37._0_16_,
                                   ZEXT416((uint)(planes[uVar30].dist + auVar38._0_4_)));
              auVar37 = ZEXT1664(auVar38);
              lVar27 = lVar27 + 0xc;
            } while ((ulong)uVar5 * 0xc != lVar27);
          }
          bVar33 = uVar30 == 0;
          bVar32 = fVar34 < auVar37._0_4_;
          if (bVar32 || bVar33) {
            uVar24 = uVar30 & 0xffffffff;
          }
          uVar29 = (uint)uVar24;
          fVar34 = (float)((uint)(bVar32 || bVar33) * (int)auVar37._0_4_ +
                          (uint)(!bVar32 && !bVar33) * (int)fVar34);
          uVar30 = uVar30 + 1;
        } while (uVar30 != (uint)planes_count);
      }
      if (fVar34 <= fVar35 * 0.025) {
        uVar29 = 0xffffffff;
      }
      if ((int)uVar29 < 0) break;
      convex_00 = ConvexHCrop(convex,planes + uVar29);
      if ((convex_00 == (ConvexH *)0x0) || (iVar23 = AssertIntact(convex_00), iVar23 == 0)) {
        bVar32 = false;
      }
      else {
        pPVar8 = (convex->facets).element;
        if (pPVar8 != (Plane *)0x0) {
          free(pPVar8);
        }
        (convex->facets).element = (Plane *)0x0;
        (convex->facets).count = 0;
        (convex->facets).array_size = 0;
        __ptr = (convex->edges).element;
        if (__ptr != (HalfEdge *)0x0) {
          free(__ptr);
        }
        (convex->edges).element = (HalfEdge *)0x0;
        (convex->edges).count = 0;
        (convex->edges).array_size = 0;
        pfVar7 = (convex->vertices).element;
        if (pfVar7 != (float3 *)0x0) {
          free(pfVar7);
        }
        (convex->vertices).element = (float3 *)0x0;
        (convex->vertices).count = 0;
        (convex->vertices).array_size = 0;
        operator_delete(convex,0x30);
        bVar32 = true;
        convex = convex_00;
      }
    } while (bVar32);
    iVar23 = AssertIntact(convex);
    if (iVar23 == 0) {
      __assert_fail("AssertIntact(*c)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0xa6f,
                    "int ConvexDecomposition::overhull(Plane *, int, float3 *, int, int, float3 *&, int &, int *&, int &, float)"
                   );
    }
    pAVar1 = &convex->edges;
    piVar25 = (int *)malloc(((long)(convex->edges).count + (long)(convex->facets).count) * 4 + 4);
    *faces_out = piVar25;
    *faces_count_out = 1;
    *piVar25 = -1;
    iVar23 = (convex->edges).count;
    iVar26 = 0;
    if (0 < iVar23) {
      uVar24 = 0;
      do {
        iVar22 = (int)uVar24;
        uVar30 = 1;
        if ((int)(iVar22 + 1U) < iVar23) {
          iVar6 = (convex->edges).count;
          if (iVar6 <= iVar22) {
LAB_00932b52:
            __function = 
            "Type &ConvexDecomposition::Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](int) [Type = ConvexDecomposition::ConvexH::HalfEdge]"
            ;
            goto LAB_00932b67;
          }
          uVar30 = (ulong)(uint)(iVar23 - iVar22);
          uVar31 = (ulong)(iVar22 + 1U);
          lVar27 = -1;
          do {
            if (((int)uVar31 < 0) || (iVar6 <= (int)uVar31)) goto LAB_00932b52;
            if (pAVar1->element[uVar24 & 0xffffffff].p != pAVar1->element[uVar31].p) {
              uVar30 = (ulong)(uint)-(int)lVar27;
              break;
            }
            lVar27 = lVar27 + -1;
            uVar31 = uVar31 + 1;
          } while (-lVar27 != uVar30);
        }
        iVar23 = *faces_count_out;
        *faces_count_out = iVar23 + 1;
        piVar25[iVar23] = (int)uVar30;
        uVar31 = uVar24 & 0xffffffff;
        do {
          if ((convex->edges).count <= (int)uVar31) goto LAB_00932b52;
          iVar23 = *faces_count_out;
          uVar24 = uVar31 + 1;
          uVar29 = (int)uVar30 - 1;
          uVar30 = (ulong)uVar29;
          bVar4 = pAVar1->element[uVar31].v;
          *faces_count_out = iVar23 + 1;
          piVar25[iVar23] = (uint)bVar4;
          uVar31 = uVar24;
        } while (uVar29 != 0);
        iVar26 = iVar26 + 1;
        iVar23 = (convex->edges).count;
      } while ((int)uVar24 < iVar23);
    }
    *piVar25 = iVar26;
    iVar23 = (convex->facets).count;
    if (iVar26 != iVar23) {
      __assert_fail("k==c->facets.count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0xa83,
                    "int ConvexDecomposition::overhull(Plane *, int, float3 *, int, int, float3 *&, int &, int *&, int &, float)"
                   );
    }
    if (*faces_count_out != iVar23 + 1 + (convex->edges).count) {
      __assert_fail("faces_count_out == 1+c->facets.count+c->edges.count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0xa84,
                    "int ConvexDecomposition::overhull(Plane *, int, float3 *, int, int, float3 *&, int &, int *&, int &, float)"
                   );
    }
    *verts_out = (convex->vertices).element;
    *verts_count_out = (convex->vertices).count;
    if (0 < (convex->vertices).count) {
      lVar27 = 0;
      lVar28 = 0;
      do {
        if ((convex->vertices).count <= lVar28) {
          __function = 
          "Type &ConvexDecomposition::Array<ConvexDecomposition::float3>::operator[](int) [Type = ConvexDecomposition::float3]"
          ;
LAB_00932b67:
          __assert_fail("i>=0 && i<count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                        ,0x577,__function);
        }
        pfVar7 = (convex->vertices).element;
        pfVar9 = *verts_out;
        uVar10 = *(undefined8 *)((long)&pfVar7->x + lVar27);
        *(undefined4 *)((long)&pfVar9->z + lVar27) = *(undefined4 *)((long)&pfVar7->z + lVar27);
        *(undefined8 *)((long)&pfVar9->x + lVar27) = uVar10;
        lVar28 = lVar28 + 1;
        lVar27 = lVar27 + 0xc;
      } while (lVar28 < (convex->vertices).count);
    }
    (convex->vertices).element = (float3 *)0x0;
    (convex->vertices).count = 0;
    (convex->vertices).array_size = 0;
    pPVar8 = (convex->facets).element;
    if (pPVar8 != (Plane *)0x0) {
      free(pPVar8);
    }
    (convex->facets).element = (Plane *)0x0;
    (convex->facets).count = 0;
    (convex->facets).array_size = 0;
    if (pAVar1->element != (HalfEdge *)0x0) {
      free(pAVar1->element);
    }
    pAVar1->element = (HalfEdge *)0x0;
    (convex->edges).count = 0;
    (convex->edges).array_size = 0;
    pfVar7 = (convex->vertices).element;
    if (pfVar7 != (float3 *)0x0) {
      free(pfVar7);
    }
    (convex->vertices).element = (float3 *)0x0;
    (convex->vertices).count = 0;
    (convex->vertices).array_size = 0;
    operator_delete(convex,0x30);
    iVar23 = 1;
  }
  return iVar23;
}

Assistant:

int overhull(Plane *planes,int planes_count,float3 *verts, int verts_count,int maxplanes, 
			 float3 *&verts_out, int &verts_count_out,  int *&faces_out, int &faces_count_out ,float inflate)
{
	int i,j;
	if(verts_count <4) return 0;
	maxplanes = Min(maxplanes,planes_count);
	float3 bmin(verts[0]),bmax(verts[0]);
	for(i=0;i<verts_count;i++) 
	{
		bmin = VectorMin(bmin,verts[i]);
		bmax = VectorMax(bmax,verts[i]);
	}
//	float diameter = magnitude(bmax-bmin);
//	inflate *=diameter;   // RELATIVE INFLATION
	bmin -= float3(inflate,inflate,inflate);
	bmax += float3(inflate,inflate,inflate);
	for(i=0;i<planes_count;i++)
	{
		planes[i].dist -= inflate;
	}
	float3 emin = bmin; // VectorMin(bmin,float3(0,0,0));
	float3 emax = bmax; // VectorMax(bmax,float3(0,0,0));
	float epsilon  = magnitude(emax-emin) * 0.025f;
	planetestepsilon = magnitude(emax-emin) * PAPERWIDTH;
	// todo: add bounding cube planes to force bevel. or try instead not adding the diameter expansion ??? must think.
	// ConvexH *convex = ConvexHMakeCube(bmin - float3(diameter,diameter,diameter),bmax+float3(diameter,diameter,diameter));
	ConvexH *c = ConvexHMakeCube(REAL3(bmin),REAL3(bmax)); 
	int k;
	while(maxplanes-- && (k=candidateplane(planes,planes_count,c,epsilon))>=0)
	{
		ConvexH *tmp = c;
		c = ConvexHCrop(*tmp,planes[k]);
		if(c==NULL) {c=tmp; break;} // might want to debug this case better!!!
		if(!AssertIntact(*c)) {c=tmp; break;} // might want to debug this case better too!!!
		delete tmp;
	}

	assert(AssertIntact(*c));
	//return c;
	faces_out = (int*)malloc(sizeof(int)*(1+c->facets.count+c->edges.count));     // new int[1+c->facets.count+c->edges.count];
	faces_count_out=0;
	i=0;
	faces_out[faces_count_out++]=-1;
	k=0;
	while(i<c->edges.count)
	{
		j=1;
		while(j+i<c->edges.count && c->edges[i].p==c->edges[i+j].p) { j++; }
		faces_out[faces_count_out++]=j;
		while(j--)
		{
			faces_out[faces_count_out++] = c->edges[i].v;
			i++;
		}
		k++;
	}
	faces_out[0]=k; // number of faces.
	assert(k==c->facets.count);
	assert(faces_count_out == 1+c->facets.count+c->edges.count);
	verts_out = c->vertices.element; // new float3[c->vertices.count]; 
	verts_count_out = c->vertices.count;
	for(i=0;i<c->vertices.count;i++)
	{
		verts_out[i] = float3(c->vertices[i]);
	}
	c->vertices.count=c->vertices.array_size=0;	c->vertices.element=NULL;
	delete c;
	return 1;
}